

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTrajectory.cpp
# Opt level: O2

void __thiscall chrono::ChLinkTrajectory::ChLinkTrajectory(ChLinkTrajectory *this)

{
  __shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2> local_30;
  undefined4 local_1c;
  undefined8 local_18;
  
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkTrajectory_011670f0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->modulo_s = false;
  (this->super_ChLinkLockLock).super_ChLinkLock.type = TRAJECTORY;
  local_1c = 0;
  local_18 = 0x3ff0000000000000;
  std::make_shared<chrono::ChFunction_Ramp,int,double>((int *)&local_30,(double *)&local_1c);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->space_fx,
             (__shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::make_shared<chrono::geometry::ChLineSegment>();
  std::__shared_ptr<chrono::geometry::ChLine,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::geometry::ChLine,(__gnu_cxx::_Lock_policy)2> *)
             &this->trajectory_line,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  ChLinkMaskLF::SetLockMask
            (&(this->super_ChLinkLockLock).super_ChLinkLock.mask,true,true,true,false,false,false,
             false);
  ChLinkLock::BuildLink((ChLinkLock *)this);
  return;
}

Assistant:

ChLinkTrajectory::ChLinkTrajectory() : modulo_s(false) {
    // initializes type
    type = LinkType::TRAJECTORY;

    // default s(t) function. User will provide better fx.
    space_fx = chrono_types::make_shared<ChFunction_Ramp>(0, 1.);

    // default trajectory is a segment
    trajectory_line = chrono_types::make_shared<ChLineSegment>();

    // Mask: initialize our LinkMaskLF (lock formulation mask) to X  only
    mask.SetLockMask(true, true, true, false, false, false, false);

    BuildLink();
}